

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

void __thiscall
bgui::ImageAdapter<float>::getPixel
          (ImageAdapter<float> *this,double *r,double *g,double *b,float x,float y,int ir,int ig,
          int ib)

{
  double dVar1;
  pointer pIVar2;
  float ***pppfVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  work_t wVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  
  if ((this->mipmap).
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mipmap).
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = (long)x;
    lVar7 = (long)y;
    pppfVar3 = this->image->img;
    *r = (double)pppfVar3[ir][lVar7][lVar6];
    *g = (double)pppfVar3[ig][lVar7][lVar6];
    dVar12 = (double)pppfVar3[ib][lVar7][lVar6];
  }
  else {
    dVar12 = log(1.0 / (this->super_ImageAdapterBase).scale);
    uVar4 = (int)(dVar12 / 0.6931471805599453) - 1;
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 3) *
            -0x49249249 - 1;
    if ((int)uVar4 < (int)uVar9) {
      uVar9 = uVar4;
    }
    uVar4 = uVar9 + 1;
    iVar8 = 1 << ((byte)uVar4 & 0x1f);
    if ((int)uVar9 < 0) {
      wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ir);
      *r = (double)wVar11;
      wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ig);
      *g = (double)wVar11;
      wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear(this->image,x,y,ib);
      *b = (double)wVar11;
      if (uVar9 != 0xffffffff) {
        return;
      }
    }
    else {
      fVar14 = (float)iVar8;
      fVar10 = x / fVar14;
      fVar14 = y / fVar14;
      wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         (pIVar2 + uVar9,fVar10,fVar14,ir);
      *r = (double)wVar11;
      wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         ((this->mipmap).
                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar9,fVar10,fVar14,ig);
      *g = (double)wVar11;
      wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                         ((this->mipmap).
                          super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar9,fVar10,fVar14,ib);
      *b = (double)wVar11;
    }
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 3);
    if (SBORROW4(uVar4,iVar5 * -0x49249249) == (int)(uVar4 + iVar5 * 0x49249249) < 0) {
      return;
    }
    dVar12 = (double)iVar8;
    dVar12 = (1.0 / (this->super_ImageAdapterBase).scale - dVar12) / dVar12;
    if (dVar12 <= 1e-06) {
      return;
    }
    dVar13 = 1.0 - dVar12;
    fVar14 = (float)(2 << ((byte)uVar4 & 0x1f));
    fVar10 = x / fVar14;
    fVar14 = y / fVar14;
    dVar1 = *r;
    wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       (pIVar2 + uVar4,fVar10,fVar14,ir);
    *r = (double)wVar11 * dVar12 + dVar1 * dVar13;
    dVar1 = *g;
    wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       ((this->mipmap).
                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4,fVar10,fVar14,ig);
    *g = (double)wVar11 * dVar12 + dVar1 * dVar13;
    dVar1 = *b;
    wVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::getBilinear
                       ((this->mipmap).
                        super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4,fVar10,fVar14,ib);
    dVar12 = (double)wVar11 * dVar12 + dVar13 * dVar1;
  }
  *b = dVar12;
  return;
}

Assistant:

void getPixel(double &r, double &g, double &b, float x, float y,
                  int ir, int ig, int ib) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);

        if (j < 0)
        {
          r=image->getBilinear(x, y, ir);
          g=image->getBilinear(x, y, ig);
          b=image->getBilinear(x, y, ib);
        }
        else
        {
          r=mipmap[j].getBilinear(x/ds, y/ds, ir);
          g=mipmap[j].getBilinear(x/ds, y/ds, ig);
          b=mipmap[j].getBilinear(x/ds, y/ds, ib);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            r=(1-f)*r+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ir);
            g=(1-f)*g+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ig);
            b=(1-f)*b+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ib);
          }
        }

        return;
      }

      r=image->get(static_cast<long>(x), static_cast<long>(y), ir);
      g=image->get(static_cast<long>(x), static_cast<long>(y), ig);
      b=image->get(static_cast<long>(x), static_cast<long>(y), ib);
    }